

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O3

double __thiscall
icu_63::double_conversion::StringToDoubleConverter::StringToIeee<char_const*>
          (StringToDoubleConverter *this,char *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  double_conversion dVar1;
  uint uVar2;
  int iVar3;
  undefined7 in_register_00000009;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  double_conversion *pdVar8;
  ulong uVar9;
  char cVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  double_conversion dVar14;
  uint uVar15;
  int iVar16;
  double_conversion *pdVar17;
  int iVar18;
  double_conversion *end;
  bool sign;
  float fVar19;
  double dVar20;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  bool result_is_junk_1;
  char *start;
  char buffer [782];
  double_conversion *local_370;
  uint local_368;
  int local_364;
  int local_360;
  bool local_359;
  int *local_358;
  double_conversion *local_350;
  double_conversion local_348 [792];
  
  *processed_characters_count = 0;
  if (length != 0) {
    end = (double_conversion *)(input + length);
    uVar2 = this->flags_;
    bVar5 = (byte)uVar2;
    local_370 = (double_conversion *)input;
    if ((uVar2 & 0x18) == 0) {
      dVar14 = (double_conversion)*input;
LAB_0024827b:
      if ((dVar14 == (double_conversion)0x2d) || (dVar14 == (double_conversion)0x2b)) {
        sign = dVar14 == (double_conversion)0x2d;
        if (local_370 + 1 != end) {
          lVar11 = 1;
          do {
            lVar12 = 0;
            while (*(double_conversion *)(&kWhitespaceTable7 + lVar12) != local_370[lVar11]) {
              lVar12 = lVar12 + 1;
              if (lVar12 == 6) {
                if (lVar11 != 1 && (char)((uVar2 & 0x20) >> 5) == '\0') goto LAB_002489a9;
                dVar14 = local_370[lVar11];
                local_370 = local_370 + lVar11;
                goto LAB_00248310;
              }
            }
            lVar12 = lVar11 + 1;
            lVar11 = lVar11 + 1;
          } while (local_370 + lVar12 != end);
        }
      }
      else {
        sign = false;
LAB_00248310:
        pdVar8 = (double_conversion *)this->infinity_symbol_;
        iVar18 = (int)input;
        cVar10 = (char)((uVar2 & 0x10) >> 4);
        if ((pdVar8 == (double_conversion *)0x0) || (dVar14 != *pdVar8)) {
          pdVar8 = (double_conversion *)this->nan_symbol_;
          if ((pdVar8 == (double_conversion *)0x0) || (dVar14 != *pdVar8)) {
            local_360 = (int)CONCAT71(in_register_00000009,read_as_double);
            iVar16 = 0;
            if (dVar14 != (double_conversion)0x30) {
              uVar6 = 0;
LAB_002483ae:
              iVar3 = 0;
              bVar4 = false;
              uVar9 = 0;
              pdVar8 = local_370;
              do {
                dVar1 = *pdVar8;
                local_358 = processed_characters_count;
                if (9 < (byte)((char)dVar1 - 0x30U)) {
                  local_368 = uVar6;
                  if (iVar16 == 0) {
                    local_368 = 0;
                  }
                  iVar13 = 0;
                  pdVar17 = pdVar8;
                  local_364 = iVar3;
                  uVar15 = local_368;
                  if (dVar1 != (double_conversion)0x2e) goto LAB_002486ea;
                  if (((~(byte)local_368 | bVar5 >> 2) & 1) == 0) goto LAB_002489a9;
                  iVar13 = 0;
                  local_370 = pdVar8;
                  if ((local_368 & 1) != 0) goto LAB_0024841b;
                  pdVar17 = pdVar8 + 1;
                  local_370 = pdVar17;
                  if (pdVar17 != end) {
                    iVar13 = 0;
                    if ((iVar16 != 0) || (iVar13 = 0, *pdVar17 != (double_conversion)0x30))
                    goto LAB_002488c3;
                    iVar13 = 0;
                    pdVar8 = pdVar8 + 2;
                    goto LAB_0024889e;
                  }
                  if (iVar16 == 0) {
                    if (dVar14 == (double_conversion)0x30) goto LAB_0024863e;
                    goto LAB_002489a9;
                  }
                  break;
                }
                if (iVar16 < 0x304) {
                  iVar13 = (int)uVar9;
                  uVar9 = (ulong)(iVar13 + 1);
                  local_348[iVar13] = dVar1;
                  iVar16 = iVar16 + 1;
                }
                else {
                  iVar3 = iVar3 + 1;
                  bVar4 = (bool)(dVar1 != (double_conversion)0x30 | bVar4);
                }
                uVar15 = uVar6 & 1;
                uVar6 = 0;
                if (uVar15 != 0) {
                  uVar6 = (uint)((char)*pdVar8 < '8');
                }
                pdVar8 = pdVar8 + 1;
              } while (pdVar8 != end);
              iVar13 = 0;
              pdVar8 = end;
              uVar15 = uVar6;
              goto LAB_0024841b;
            }
            pdVar8 = local_370 + 1;
            if (pdVar8 != end) {
              if (((uVar2 & 1) != 0) && (((byte)*pdVar8 | 0x20) == 0x78)) {
                local_370 = local_370 + 2;
                if ((local_370 != end) &&
                   ((dVar14 = *local_370, (char)dVar14 < 0x40 && (int)(char)dVar14 - 0x30U < 10 ||
                    (((byte)dVar14 - 0x41 < 0x26 &&
                     ((0x3f0000003fU >> ((ulong)((byte)dVar14 - 0x41) & 0x3f) & 1) != 0)))))) {
                  dVar20 = RadixStringToIeee<4,char_const*>
                                     ((char **)&local_370,(char *)end,sign,SUB41((uVar2 & 4) >> 2,0)
                                      ,this->junk_string_value_,read_as_double,(bool *)local_348);
                  if (local_348[0] != (double_conversion)0x0) {
                    return dVar20;
                  }
                  pdVar8 = local_370;
                  if (local_370 != end && (uVar2 & 0x10) != 0) {
                    do {
                      lVar11 = 0;
                      while (*(double_conversion *)(&kWhitespaceTable7 + lVar11) != *local_370) {
                        lVar11 = lVar11 + 1;
                        pdVar8 = local_370;
                        if (lVar11 == 6) goto LAB_0024853d;
                      }
                      local_370 = local_370 + 1;
                      pdVar8 = end;
                    } while (local_370 != end);
                  }
LAB_0024853d:
                  *processed_characters_count = (int)pdVar8 - iVar18;
                  return dVar20;
                }
                goto LAB_002489a9;
              }
              do {
                if (*pdVar8 != (double_conversion)0x30) {
                  uVar6 = (uint)(bVar5 >> 1);
                  local_370 = pdVar8;
                  goto LAB_002483ae;
                }
                pdVar8 = pdVar8 + 1;
              } while (pdVar8 != end);
            }
            *processed_characters_count = length;
LAB_0024855d:
            if (sign == false) {
              return 0.0;
            }
            return -0.0;
          }
          while( true ) {
            local_370 = local_370 + 1;
            pdVar8 = pdVar8 + 1;
            if (*pdVar8 == (double_conversion)0x0) break;
            if ((local_370 == end) || (*local_370 != *pdVar8)) goto LAB_002489a9;
          }
          if ((cVar10 != '\0' || (char)((uVar2 & 4) >> 2) != '\0') || (local_370 == end)) {
            pdVar8 = local_370;
            if ((uVar2 & 4) == 0) {
              for (; pdVar8 != end; pdVar8 = pdVar8 + 1) {
                lVar11 = 0;
                while (*(double_conversion *)(&kWhitespaceTable7 + lVar11) != *pdVar8) {
                  lVar11 = lVar11 + 1;
                  if (lVar11 == 6) goto LAB_002489a9;
                }
                local_370 = end;
              }
            }
            *processed_characters_count = (int)local_370 - iVar18;
            if (sign != false) {
              return -NAN;
            }
            return NAN;
          }
        }
        else {
          while( true ) {
            local_370 = local_370 + 1;
            pdVar8 = pdVar8 + 1;
            if (*pdVar8 == (double_conversion)0x0) break;
            if ((local_370 == end) || (*local_370 != *pdVar8)) goto LAB_002489a9;
          }
          if ((cVar10 != '\0' || (char)((uVar2 & 4) >> 2) != '\0') || (local_370 == end)) {
            pdVar8 = local_370;
            if ((uVar2 & 4) == 0) {
              for (; pdVar8 != end; pdVar8 = pdVar8 + 1) {
                lVar11 = 0;
                while (*(double_conversion *)(&kWhitespaceTable7 + lVar11) != *pdVar8) {
                  lVar11 = lVar11 + 1;
                  if (lVar11 == 6) goto LAB_002489a9;
                }
                local_370 = end;
              }
            }
            *processed_characters_count = (int)local_370 - iVar18;
            if (sign != false) {
              return -INFINITY;
            }
            return INFINITY;
          }
        }
      }
      goto LAB_002489a9;
    }
    do {
      dVar14 = *local_370;
      lVar11 = 0;
      while (*(double_conversion *)(&kWhitespaceTable7 + lVar11) != dVar14) {
        lVar11 = lVar11 + 1;
        if (lVar11 == 6) {
          if (local_370 == (double_conversion *)input || (char)((uVar2 & 8) >> 3) != '\0')
          goto LAB_0024827b;
          goto LAB_002489a9;
        }
      }
      local_370 = local_370 + 1;
    } while (local_370 != end);
    *processed_characters_count = length;
  }
  return this->empty_string_value_;
  while( true ) {
    iVar13 = iVar13 + -1;
    pdVar8 = pdVar17 + 1;
    local_370 = pdVar17;
    if (*pdVar17 != (double_conversion)0x30) break;
LAB_0024889e:
    pdVar17 = pdVar8;
    if (pdVar17 == end) {
      *processed_characters_count = length;
      goto LAB_0024855d;
    }
  }
LAB_002488c3:
  do {
    dVar1 = *pdVar17;
    if (9 < (byte)((char)dVar1 - 0x30U)) goto LAB_002486ea;
    if (iVar16 < 0x304) {
      iVar7 = (int)uVar9;
      uVar9 = (ulong)(iVar7 + 1);
      local_348[iVar7] = dVar1;
      iVar16 = iVar16 + 1;
      iVar13 = iVar13 + -1;
    }
    else {
      bVar4 = (bool)(dVar1 != (double_conversion)0x30 | bVar4);
    }
    pdVar17 = pdVar17 + 1;
    pdVar8 = end;
  } while (pdVar17 != end);
  goto LAB_0024841b;
LAB_002486ea:
  if ((iVar16 == 0 && iVar13 == 0) && dVar14 != (double_conversion)0x30) goto LAB_002489a9;
  local_370 = pdVar17;
  if (((byte)*pdVar17 | 0x20) == 0x65) {
    if (((~(byte)local_368 | bVar5 >> 2) & 1) == 0) goto LAB_002489a9;
    pdVar8 = pdVar17;
    if ((local_368 & 1) != 0) goto LAB_0024841b;
    local_370 = pdVar17 + 1;
    pdVar8 = end;
    if (local_370 != end) {
      dVar14 = *local_370;
      if (dVar14 == (double_conversion)0x2d) {
LAB_00248844:
        local_370 = pdVar17 + 2;
        local_364 = CONCAT31(local_364._1_3_,dVar14);
        if (local_370 == end) goto joined_r0x0024891c;
      }
      else {
        local_364._1_3_ = (undefined3)((uint)iVar3 >> 8);
        local_364 = CONCAT31(local_364._1_3_,0x2b);
        if (dVar14 == (double_conversion)0x2b) goto LAB_00248844;
      }
      pdVar8 = local_370;
      if ((local_370 != end) && (dVar14 = *local_370, 0xf5 < (byte)((char)dVar14 - 0x3aU))) {
        iVar16 = 0;
        do {
          local_370 = local_370 + 1;
          if ((iVar16 < 0x6666666) ||
             ((iVar7 = 0x3fffffff, iVar16 == 0x6666666 && ((byte)dVar14 < 0x34)))) {
            iVar7 = (uint)(byte)dVar14 + iVar16 * 10 + -0x30;
          }
          iVar16 = iVar7;
        } while ((local_370 != end) && (dVar14 = *local_370, (byte)((char)dVar14 - 0x30U) < 10));
        iVar7 = -iVar16;
        if ((char)local_364 != '-') {
          iVar7 = iVar16;
        }
        iVar13 = iVar13 + iVar7;
        goto LAB_00248992;
      }
    }
joined_r0x0024891c:
    if ((uVar2 & 4) != 0) {
LAB_0024841b:
      if ((uVar15 & 1) != 0) {
        local_350 = local_348;
        dVar20 = RadixStringToIeee<3,char*>
                           ((char **)&local_350,(char *)(local_348 + (int)uVar9),sign,
                            SUB41((uVar2 & 4) >> 2,0),this->junk_string_value_,read_as_double,
                            &local_359);
        *local_358 = (int)pdVar8 - iVar18;
        return dVar20;
      }
      iVar3 = iVar3 + iVar13;
      end = pdVar8;
LAB_0024863e:
      if (bVar4) {
        iVar16 = (int)uVar9;
        uVar9 = (ulong)(iVar16 + 1);
        local_348[iVar16] = (double_conversion)0x31;
        iVar3 = iVar3 + -1;
      }
      local_348[(int)uVar9] = (double_conversion)0x0;
      if (read_as_double) {
        buffer_00.length_ = iVar3;
        buffer_00.start_ = (char *)uVar9;
        buffer_00._12_4_ = 0;
        dVar20 = Strtod(local_348,buffer_00,local_360);
      }
      else {
        buffer_01.length_ = iVar3;
        buffer_01.start_ = (char *)uVar9;
        buffer_01._12_4_ = 0;
        fVar19 = Strtof(local_348,buffer_01,local_360);
        dVar20 = (double)fVar19;
      }
      *local_358 = (int)end - iVar18;
      if (sign == false) {
        return dVar20;
      }
      return -dVar20;
    }
  }
  else {
LAB_00248992:
    if ((cVar10 != '\0' || (char)((uVar2 & 4) >> 2) != '\0') || (local_370 == end)) {
      if ((uVar2 & 4) == 0) {
        for (; local_370 != end; local_370 = local_370 + 1) {
          lVar11 = 0;
          while (*(double_conversion *)(&kWhitespaceTable7 + lVar11) != *local_370) {
            lVar11 = lVar11 + 1;
            if (lVar11 == 6) goto LAB_002489a9;
          }
        }
      }
      pdVar8 = local_370;
      pdVar17 = local_370;
      if ((uVar2 & 0x10) != 0) {
        for (; pdVar17 != end; pdVar17 = pdVar17 + 1) {
          lVar11 = 0;
          while (*(double_conversion *)(&kWhitespaceTable7 + lVar11) != *pdVar17) {
            lVar11 = lVar11 + 1;
            pdVar8 = pdVar17;
            if (lVar11 == 6) goto LAB_0024841b;
          }
          pdVar8 = end;
        }
      }
      goto LAB_0024841b;
    }
  }
LAB_002489a9:
  return this->junk_string_value_;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}